

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zpanel_bmod.c
# Opt level: O1

void zpanel_bmod(int m,int w,int jcol,int nseg,doublecomplex *dense,doublecomplex *tempv,int *segrep
                ,int *repfnz,GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  uint ncol;
  long lVar1;
  undefined8 *puVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  flops_t *pfVar15;
  int *piVar16;
  int *piVar17;
  int_t *piVar18;
  int_t *piVar19;
  void *pvVar20;
  int_t *piVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  long lVar30;
  doublecomplex *pdVar31;
  int iVar32;
  int iVar33;
  double *pdVar34;
  doublecomplex *pdVar35;
  int iVar36;
  long lVar37;
  int *piVar38;
  ulong uVar39;
  doublecomplex *pdVar40;
  int iVar41;
  long lVar42;
  long lVar43;
  int iVar44;
  long lVar45;
  int iVar46;
  ulong uVar47;
  int iVar48;
  int iVar49;
  ulong uVar50;
  int iVar51;
  doublecomplex *pdVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  doublecomplex zero;
  int local_180;
  
  pfVar15 = stat->ops;
  piVar16 = Glu->xsup;
  piVar17 = Glu->supno;
  piVar18 = Glu->lsub;
  piVar19 = Glu->xlsub;
  pvVar20 = Glu->lusup;
  piVar21 = Glu->xlusup;
  iVar22 = sp_ienv(3);
  iVar23 = sp_ienv(7);
  iVar22 = sp_ienv((uint)(iVar22 <= iVar23) * 4 + 3);
  iVar23 = sp_ienv(4);
  iVar24 = sp_ienv(5);
  if (0 < nseg) {
    iVar25 = iVar23 + iVar22;
    iVar48 = jcol + w;
    uVar39 = (ulong)(uint)nseg;
    lVar1 = (long)pvVar20 + 0x18;
    iVar44 = 0;
    do {
      iVar12 = segrep[uVar39 - 1];
      iVar13 = piVar16[piVar17[iVar12]];
      iVar46 = iVar12 - iVar13;
      iVar51 = iVar46 + 1;
      iVar14 = piVar19[iVar13];
      iVar26 = piVar19[(long)iVar13 + 1] - iVar14;
      iVar36 = iVar26 - iVar51;
      local_180 = iVar14 + iVar46 + 1;
      iVar27 = iVar14 + iVar46;
      if ((iVar51 < iVar24) || (iVar36 <= iVar23)) {
        if (0 < w) {
          lVar30 = (long)local_180;
          piVar38 = repfnz;
          pdVar35 = dense;
          iVar33 = jcol;
          do {
            iVar41 = piVar38[iVar12];
            if (iVar41 != -1) {
              ncol = (iVar12 - iVar41) + 1;
              iVar49 = piVar21[iVar13];
              pfVar15[0x13] = (float)(int)((iVar12 - iVar41) * ncol * 4) + pfVar15[0x13];
              pfVar15[0x14] = (float)(int)(iVar36 * 8 * ncol) + pfVar15[0x14];
              if (iVar12 == iVar41) {
                iVar41 = piVar19[(long)iVar13 + 1];
                if (local_180 < iVar41) {
                  dVar55 = pdVar35[piVar18[iVar27]].r;
                  dVar56 = pdVar35[piVar18[iVar27]].i;
                  pdVar34 = (double *)
                            ((long)pvVar20 + (long)(iVar49 + iVar46 * iVar26 + iVar51) * 0x10 + 8);
                  lVar37 = lVar30;
                  do {
                    iVar49 = piVar18[lVar37];
                    dVar53 = pdVar34[-1];
                    dVar3 = *pdVar34;
                    dVar54 = pdVar35[iVar49].i;
                    pdVar35[iVar49].r = pdVar35[iVar49].r - (dVar55 * dVar53 + dVar3 * -dVar56);
                    pdVar35[iVar49].i = dVar54 - (dVar53 * dVar56 + dVar3 * dVar55);
                    lVar37 = lVar37 + 1;
                    pdVar34 = pdVar34 + 2;
                  } while (lVar37 < iVar41);
                }
              }
              else if (iVar12 - iVar41 < 3) {
                iVar41 = piVar18[iVar27];
                pdVar40 = pdVar35 + iVar41;
                iVar49 = iVar49 + (iVar26 + 1) * iVar46;
                iVar32 = piVar18[(long)iVar27 + -1];
                dVar55 = pdVar35[iVar32].r;
                dVar56 = pdVar35[iVar32].i;
                iVar29 = iVar49 - iVar26;
                if (ncol == 2) {
                  lVar37 = (long)iVar29 * 0x10;
                  dVar53 = *(double *)((long)pvVar20 + lVar37 + 8);
                  dVar3 = pdVar35[iVar41].r -
                          (dVar55 * *(double *)((long)pvVar20 + lVar37) - dVar53 * dVar56);
                  dVar53 = pdVar35[iVar41].i -
                           (*(double *)((long)pvVar20 + lVar37) * dVar56 + dVar53 * dVar55);
                  pdVar40->r = dVar3;
                  pdVar40->i = dVar53;
                  iVar41 = piVar19[(long)iVar13 + 1];
                  if (local_180 < iVar41) {
                    lVar42 = lVar1;
                    lVar45 = lVar30;
                    do {
                      iVar32 = piVar18[lVar45];
                      dVar54 = *(double *)(lVar42 + -8 + (long)iVar49 * 0x10);
                      dVar4 = *(double *)(lVar42 + (long)iVar49 * 0x10);
                      dVar5 = *(double *)(lVar42 + -8 + lVar37);
                      dVar6 = *(double *)(lVar42 + lVar37);
                      dVar7 = pdVar35[iVar32].i;
                      pdVar35[iVar32].r =
                           pdVar35[iVar32].r -
                           (dVar55 * dVar5 + dVar6 * -dVar56 + dVar3 * dVar54 + dVar4 * -dVar53);
                      pdVar35[iVar32].i =
                           dVar7 - (dVar5 * dVar56 + dVar6 * dVar55 +
                                   dVar54 * dVar53 + dVar4 * dVar3);
                      lVar45 = lVar45 + 1;
                      lVar42 = lVar42 + 0x10;
                    } while (lVar45 < iVar41);
                  }
                }
                else {
                  dVar53 = pdVar35[piVar18[(long)iVar27 + -2]].r;
                  dVar3 = pdVar35[piVar18[(long)iVar27 + -2]].i;
                  lVar42 = (long)(iVar29 - iVar26) * 0x10;
                  dVar54 = *(double *)((long)pvVar20 + lVar42 + -0x10);
                  dVar4 = *(double *)((long)pvVar20 + lVar42 + -8);
                  dVar55 = dVar55 - (dVar53 * dVar54 - dVar4 * dVar3);
                  dVar56 = dVar56 - (dVar54 * dVar3 + dVar4 * dVar53);
                  lVar37 = (long)iVar29 * 0x10;
                  dVar54 = *(double *)((long)pvVar20 + lVar37 + 8);
                  dVar4 = *(double *)((long)pvVar20 + lVar42 + 8);
                  dVar5 = pdVar35[iVar41].r -
                          ((dVar53 * *(double *)((long)pvVar20 + lVar42) - dVar4 * dVar3) +
                          (dVar55 * *(double *)((long)pvVar20 + lVar37) - dVar54 * dVar56));
                  dVar54 = pdVar35[iVar41].i -
                           (*(double *)((long)pvVar20 + lVar42) * dVar3 + dVar4 * dVar53 +
                           *(double *)((long)pvVar20 + lVar37) * dVar56 + dVar54 * dVar55);
                  pdVar40->r = dVar5;
                  pdVar40->i = dVar54;
                  pdVar35[iVar32].r = dVar55;
                  pdVar35[iVar32].i = dVar56;
                  iVar41 = piVar19[(long)iVar13 + 1];
                  if (local_180 < iVar41) {
                    lVar43 = (long)iVar26 * -0x10 + lVar37;
                    lVar42 = lVar1;
                    lVar45 = lVar30;
                    do {
                      iVar32 = piVar18[lVar45];
                      dVar4 = *(double *)(lVar42 + -8 + (long)iVar49 * 0x10);
                      dVar6 = *(double *)(lVar42 + (long)iVar49 * 0x10);
                      dVar7 = *(double *)(lVar42 + -8 + lVar37);
                      dVar8 = *(double *)(lVar42 + lVar37);
                      dVar9 = *(double *)(lVar42 + -8 + lVar43);
                      dVar10 = *(double *)(lVar42 + lVar43);
                      dVar11 = pdVar35[iVar32].i;
                      pdVar35[iVar32].r =
                           pdVar35[iVar32].r -
                           (dVar53 * dVar9 + dVar10 * -dVar3 +
                           dVar55 * dVar7 + dVar8 * -dVar56 + dVar5 * dVar4 + dVar6 * -dVar54);
                      pdVar35[iVar32].i =
                           dVar11 - (dVar9 * dVar3 + dVar10 * dVar53 +
                                    dVar7 * dVar56 + dVar8 * dVar55 + dVar4 * dVar54 + dVar6 * dVar5
                                    );
                      lVar45 = lVar45 + 1;
                      lVar42 = lVar42 + 0x10;
                    } while (lVar45 < iVar41);
                  }
                }
              }
              else {
                uVar50 = (ulong)(uint)((iVar12 + 1) - iVar41);
                iVar32 = (iVar41 - iVar13) + iVar14;
                lVar37 = 0;
                uVar47 = uVar50;
                do {
                  dVar55 = pdVar35[*(int *)((long)piVar18 + lVar37 + (long)iVar32 * 4)].i;
                  pdVar34 = (double *)((long)&tempv->r + lVar37 * 4);
                  *pdVar34 = pdVar35[*(int *)((long)piVar18 + lVar37 + (long)iVar32 * 4)].r;
                  pdVar34[1] = dVar55;
                  lVar37 = lVar37 + 4;
                  uVar47 = uVar47 - 1;
                } while (uVar47 != 0);
                iVar49 = iVar49 + (iVar41 - iVar13) * (iVar26 + 1);
                zlsolve(iVar26,ncol,(doublecomplex *)((long)iVar49 * 0x10 + (long)pvVar20),tempv);
                pdVar52 = tempv + ncol;
                zmatvec(iVar26,iVar36,ncol,
                        (doublecomplex *)((long)(int)(iVar49 + ncol) * 0x10 + (long)pvVar20),tempv,
                        pdVar52);
                uVar47 = 0;
                pdVar40 = tempv;
                iVar41 = iVar32;
                do {
                  iVar49 = piVar18[(long)iVar32 + uVar47];
                  dVar55 = pdVar40->i;
                  pdVar35[iVar49].r = pdVar40->r;
                  pdVar35[iVar49].i = dVar55;
                  pdVar40->r = 0.0;
                  pdVar40->i = 0.0;
                  uVar47 = uVar47 + 1;
                  pdVar40 = pdVar40 + 1;
                  iVar41 = iVar41 + 1;
                } while (uVar50 != uVar47);
                if (0 < iVar36) {
                  lVar37 = 0;
                  do {
                    iVar49 = piVar18[iVar41 + lVar37];
                    dVar55 = pdVar35[iVar49].i;
                    pdVar35[iVar49].r = pdVar35[iVar49].r - pdVar52->r;
                    pdVar35[iVar49].i = dVar55 - pdVar52->i;
                    pdVar52->r = 0.0;
                    pdVar52->i = 0.0;
                    lVar37 = lVar37 + 1;
                    pdVar52 = pdVar52 + 1;
                  } while (lVar37 < iVar36);
                }
              }
            }
            iVar33 = iVar33 + 1;
            piVar38 = piVar38 + m;
            pdVar35 = pdVar35 + m;
          } while (iVar33 < iVar48);
        }
      }
      else {
        if (0 < w) {
          lVar30 = (long)local_180;
          pdVar35 = tempv;
          pdVar40 = dense;
          piVar38 = repfnz;
          iVar33 = jcol;
          do {
            iVar41 = piVar38[iVar12];
            if (iVar41 != -1) {
              iVar49 = (iVar12 - iVar41) + 1;
              iVar32 = piVar21[iVar13];
              pfVar15[0x13] = (float)((iVar12 - iVar41) * iVar49 * 4) + pfVar15[0x13];
              pfVar15[0x14] = (float)(iVar36 * 8 * iVar49) + pfVar15[0x14];
              if (iVar12 == iVar41) {
                iVar41 = piVar19[(long)iVar13 + 1];
                if (local_180 < iVar41) {
                  dVar55 = pdVar40[piVar18[iVar27]].r;
                  dVar56 = pdVar40[piVar18[iVar27]].i;
                  pdVar34 = (double *)
                            ((long)pvVar20 + (long)(iVar32 + iVar46 * iVar26 + iVar51) * 0x10 + 8);
                  lVar37 = lVar30;
                  do {
                    iVar49 = piVar18[lVar37];
                    dVar53 = pdVar34[-1];
                    dVar3 = *pdVar34;
                    dVar54 = pdVar40[iVar49].i;
                    pdVar40[iVar49].r = pdVar40[iVar49].r - (dVar55 * dVar53 + dVar3 * -dVar56);
                    pdVar40[iVar49].i = dVar54 - (dVar53 * dVar56 + dVar3 * dVar55);
                    lVar37 = lVar37 + 1;
                    pdVar34 = pdVar34 + 2;
                  } while (lVar37 < iVar41);
                }
              }
              else if (iVar12 - iVar41 < 3) {
                iVar41 = piVar18[iVar27];
                pdVar52 = pdVar40 + iVar41;
                iVar29 = piVar18[(long)iVar27 + -1];
                dVar55 = pdVar40[iVar29].r;
                dVar56 = pdVar40[iVar29].i;
                iVar32 = iVar32 + (iVar26 + 1) * iVar46;
                iVar28 = iVar32 - iVar26;
                if (iVar49 == 2) {
                  lVar37 = (long)iVar28 * 0x10;
                  dVar53 = *(double *)((long)pvVar20 + lVar37 + 8);
                  dVar3 = pdVar40[iVar41].r -
                          (dVar55 * *(double *)((long)pvVar20 + lVar37) - dVar53 * dVar56);
                  dVar53 = pdVar40[iVar41].i -
                           (*(double *)((long)pvVar20 + lVar37) * dVar56 + dVar53 * dVar55);
                  pdVar52->r = dVar3;
                  pdVar52->i = dVar53;
                  iVar41 = piVar19[(long)iVar13 + 1];
                  if (local_180 < iVar41) {
                    lVar42 = lVar1;
                    lVar45 = lVar30;
                    do {
                      iVar49 = piVar18[lVar45];
                      dVar54 = *(double *)(lVar42 + -8 + (long)iVar32 * 0x10);
                      dVar4 = *(double *)(lVar42 + (long)iVar32 * 0x10);
                      dVar5 = *(double *)(lVar42 + -8 + lVar37);
                      dVar6 = *(double *)(lVar42 + lVar37);
                      dVar7 = pdVar40[iVar49].i;
                      pdVar40[iVar49].r =
                           pdVar40[iVar49].r -
                           (dVar55 * dVar5 + dVar6 * -dVar56 + dVar3 * dVar54 + dVar4 * -dVar53);
                      pdVar40[iVar49].i =
                           dVar7 - (dVar5 * dVar56 + dVar6 * dVar55 +
                                   dVar54 * dVar53 + dVar4 * dVar3);
                      lVar45 = lVar45 + 1;
                      lVar42 = lVar42 + 0x10;
                    } while (lVar45 < iVar41);
                  }
                }
                else {
                  dVar53 = pdVar40[piVar18[(long)iVar27 + -2]].r;
                  dVar3 = pdVar40[piVar18[(long)iVar27 + -2]].i;
                  lVar42 = (long)(iVar28 - iVar26) * 0x10;
                  dVar54 = *(double *)((long)pvVar20 + lVar42 + -0x10);
                  dVar4 = *(double *)((long)pvVar20 + lVar42 + -8);
                  dVar55 = dVar55 - (dVar53 * dVar54 - dVar4 * dVar3);
                  dVar56 = dVar56 - (dVar54 * dVar3 + dVar4 * dVar53);
                  lVar37 = (long)iVar28 * 0x10;
                  dVar54 = *(double *)((long)pvVar20 + lVar37 + 8);
                  dVar4 = *(double *)((long)pvVar20 + lVar42 + 8);
                  dVar5 = pdVar40[iVar41].r -
                          ((dVar53 * *(double *)((long)pvVar20 + lVar42) - dVar4 * dVar3) +
                          (dVar55 * *(double *)((long)pvVar20 + lVar37) - dVar54 * dVar56));
                  dVar54 = pdVar40[iVar41].i -
                           (*(double *)((long)pvVar20 + lVar42) * dVar3 + dVar4 * dVar53 +
                           *(double *)((long)pvVar20 + lVar37) * dVar56 + dVar54 * dVar55);
                  pdVar52->r = dVar5;
                  pdVar52->i = dVar54;
                  pdVar40[iVar29].r = dVar55;
                  pdVar40[iVar29].i = dVar56;
                  iVar41 = piVar19[(long)iVar13 + 1];
                  if (local_180 < iVar41) {
                    lVar43 = (long)iVar26 * -0x10 + lVar37;
                    lVar42 = lVar1;
                    lVar45 = lVar30;
                    do {
                      iVar49 = piVar18[lVar45];
                      dVar4 = *(double *)(lVar42 + -8 + (long)iVar32 * 0x10);
                      dVar6 = *(double *)(lVar42 + (long)iVar32 * 0x10);
                      dVar7 = *(double *)(lVar42 + -8 + lVar37);
                      dVar8 = *(double *)(lVar42 + lVar37);
                      dVar9 = *(double *)(lVar42 + -8 + lVar43);
                      dVar10 = *(double *)(lVar42 + lVar43);
                      dVar11 = pdVar40[iVar49].i;
                      pdVar40[iVar49].r =
                           pdVar40[iVar49].r -
                           (dVar53 * dVar9 + dVar10 * -dVar3 +
                           dVar55 * dVar7 + dVar8 * -dVar56 + dVar5 * dVar4 + dVar6 * -dVar54);
                      pdVar40[iVar49].i =
                           dVar11 - (dVar9 * dVar3 + dVar10 * dVar53 +
                                    dVar7 * dVar56 + dVar8 * dVar55 + dVar4 * dVar54 + dVar6 * dVar5
                                    );
                      lVar45 = lVar45 + 1;
                      lVar42 = lVar42 + 0x10;
                    } while (lVar45 < iVar41);
                  }
                }
              }
              else {
                uVar47 = (ulong)(uint)((iVar12 + 1) - iVar41);
                lVar37 = 0;
                do {
                  dVar55 = pdVar40[*(int *)((long)piVar18 +
                                           lVar37 + (long)(iVar14 + (iVar41 - iVar13)) * 4)].i;
                  pdVar34 = (double *)((long)&pdVar35->r + lVar37 * 4);
                  *pdVar34 = pdVar40[*(int *)((long)piVar18 +
                                             lVar37 + (long)(iVar14 + (iVar41 - iVar13)) * 4)].r;
                  pdVar34[1] = dVar55;
                  lVar37 = lVar37 + 4;
                  uVar47 = uVar47 - 1;
                } while (uVar47 != 0);
                zlsolve(iVar26,iVar49,
                        (doublecomplex *)
                        ((long)(iVar32 + (iVar41 - iVar13) * (iVar26 + 1)) * 0x10 + (long)pvVar20),
                        pdVar35);
              }
            }
            iVar33 = iVar33 + 1;
            piVar38 = piVar38 + m;
            pdVar40 = pdVar40 + m;
            pdVar35 = pdVar35 + iVar25;
          } while (iVar33 < iVar48);
        }
        if (0 < iVar36) {
          iVar27 = 0;
          do {
            iVar33 = iVar27 + iVar23;
            iVar46 = iVar33;
            if (iVar36 < iVar33) {
              iVar46 = iVar36;
            }
            iVar41 = iVar46 - iVar27;
            if (iVar23 < iVar46 - iVar27) {
              iVar41 = iVar23;
            }
            if (0 < w) {
              iVar46 = piVar21[iVar13];
              piVar38 = repfnz;
              pdVar35 = dense;
              pdVar40 = tempv + iVar22;
              pdVar52 = tempv;
              iVar49 = jcol;
              do {
                iVar32 = piVar38[iVar12];
                if (((iVar32 != -1) && (2 < iVar12 - iVar32)) &&
                   (zmatvec(iVar26,iVar41,(iVar12 - iVar32) + 1,
                            (doublecomplex *)
                            ((long)((iVar32 - iVar13) * iVar26 + iVar27 + iVar51 + iVar46) * 0x10 +
                            (long)pvVar20),pdVar52,pdVar52 + iVar22), 0 < iVar41)) {
                  lVar30 = 0;
                  pdVar31 = pdVar40;
                  do {
                    iVar32 = piVar18[local_180 + lVar30];
                    dVar55 = pdVar35[iVar32].i;
                    pdVar35[iVar32].r = pdVar35[iVar32].r - pdVar31->r;
                    pdVar35[iVar32].i = dVar55 - pdVar31->i;
                    pdVar31->r = 0.0;
                    pdVar31->i = 0.0;
                    lVar30 = lVar30 + 1;
                    pdVar31 = pdVar31 + 1;
                  } while (lVar30 < iVar41);
                }
                iVar49 = iVar49 + 1;
                piVar38 = piVar38 + m;
                pdVar35 = pdVar35 + m;
                pdVar52 = pdVar52 + iVar25;
                pdVar40 = pdVar40 + iVar25;
              } while (iVar49 < iVar48);
            }
            local_180 = local_180 + iVar23;
            iVar27 = iVar33;
          } while (iVar33 < iVar36);
        }
        if (0 < w) {
          pdVar35 = tempv;
          piVar38 = repfnz;
          pdVar40 = dense;
          iVar26 = jcol;
          do {
            iVar27 = piVar38[iVar12];
            if ((iVar27 != -1) && (2 < iVar12 - iVar27)) {
              uVar47 = (ulong)(uint)((iVar12 + 1) - iVar27);
              lVar30 = 0;
              do {
                iVar36 = *(int *)((long)piVar18 + lVar30 + (long)((iVar14 - iVar13) + iVar27) * 4);
                pdVar34 = (double *)((long)&pdVar35->r + lVar30 * 4);
                dVar55 = pdVar34[1];
                pdVar40[iVar36].r = *pdVar34;
                pdVar40[iVar36].i = dVar55;
                puVar2 = (undefined8 *)((long)&pdVar35->r + lVar30 * 4);
                *puVar2 = 0;
                puVar2[1] = 0;
                lVar30 = lVar30 + 4;
                uVar47 = uVar47 - 1;
              } while (uVar47 != 0);
            }
            iVar26 = iVar26 + 1;
            piVar38 = piVar38 + m;
            pdVar40 = pdVar40 + m;
            pdVar35 = pdVar35 + iVar25;
          } while (iVar26 < iVar48);
        }
      }
      uVar39 = uVar39 - 1;
      iVar44 = iVar44 + 1;
    } while (iVar44 != nseg);
  }
  return;
}

Assistant:

void
zpanel_bmod (
	    const int  m,          /* in - number of rows in the matrix */
	    const int  w,          /* in */
	    const int  jcol,       /* in */
	    const int  nseg,       /* in */
	    doublecomplex     *dense,     /* out, of size n by w */
	    doublecomplex     *tempv,     /* working array */
	    int        *segrep,    /* in */
	    int        *repfnz,    /* in, of size n by w */
	    GlobalLU_t *Glu,       /* modified */
	    SuperLUStat_t *stat    /* output */
	    )
{


#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
         ftcs2 = _cptofcd("N", strlen("N")),
         ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int          incx = 1, incy = 1;
    doublecomplex       alpha, beta;
#endif

    register int k, ksub;
    int          fsupc, nsupc, nsupr, nrow;
    int          krep, krep_ind;
    doublecomplex       ukj, ukj1, ukj2;
    int_t        luptr, luptr1, luptr2;
    int          segsze;
    int          block_nrow;  /* no of rows in a block row */
    int_t        lptr;	      /* Points to the row subscripts of a supernode */
    int          kfnz, irow, no_zeros; 
    register int isub, isub1, i;
    register int jj;	      /* Index through each column in the panel */
    int          *xsup, *supno;
    int_t        *lsub, *xlsub;
    doublecomplex       *lusup;
    int_t        *xlusup;
    int          *repfnz_col; /* repfnz[] for a column in the panel */
    doublecomplex       *dense_col;  /* dense[] for a column in the panel */
    doublecomplex       *tempv1;             /* Used in 1-D update */
    doublecomplex       *TriTmp, *MatvecTmp; /* used in 2-D update */
    doublecomplex      zero = {0.0, 0.0};
    doublecomplex      one = {1.0, 0.0};
    doublecomplex      comp_temp, comp_temp1;
    register int ldaTmp;
    register int r_ind, r_hi;
    int  maxsuper, rowblk, colblk;
    flops_t  *ops = stat->ops;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (doublecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;
    
    maxsuper = SUPERLU_MAX( sp_ienv(3), sp_ienv(7) );
    rowblk   = sp_ienv(4);
    colblk   = sp_ienv(5);
    ldaTmp   = maxsuper + rowblk;

    /* 
     * For each nonz supernode segment of U[*,j] in topological order 
     */
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) { /* for each updating supernode */

	/* krep = representative of current k-th supernode
	 * fsupc = first supernodal column
	 * nsupc = no of columns in a supernode
	 * nsupr = no of rows in a supernode
	 */
        krep = segrep[k--];
	fsupc = xsup[supno[krep]];
	nsupc = krep - fsupc + 1;
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];
	nrow = nsupr - nsupc;
	lptr = xlsub[fsupc];
	krep_ind = lptr + nsupc - 1;

	repfnz_col = repfnz;
	dense_col = dense;
	
	if ( nsupc >= colblk && nrow > rowblk ) { /* 2-D block update */

	    TriTmp = tempv;
	
	    /* Sequence through each column in panel -- triangular solves */
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m, TriTmp += ldaTmp ) {

		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue;	/* Skip any zero segment */
	    
		segsze = krep - kfnz + 1;
		luptr = xlusup[fsupc];

		ops[TRSV] += 4 * segsze * (segsze - 1);
		ops[GEMV] += 8 * nrow * segsze;
	
		/* Case 1: Update U-segment of size 1 -- col-col update */
		if ( segsze == 1 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc;

		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; i++) {
			irow = lsub[i];
	    	        zz_mult(&comp_temp, &ukj, &lusup[luptr]);
		        z_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			++luptr;
		    }

		} else if ( segsze <= 3 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    ukj1 = dense_col[lsub[krep_ind - 1]];
		    luptr += nsupr*(nsupc-1) + nsupc-1;
		    luptr1 = luptr - nsupr;

		    if ( segsze == 2 ) {
		        zz_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		        z_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    luptr++; luptr1++;
			    zz_mult(&comp_temp, &ukj, &lusup[luptr]);
			    zz_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    z_add(&comp_temp, &comp_temp, &comp_temp1);
			    z_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    } else {
			ukj2 = dense_col[lsub[krep_ind - 2]];
			luptr2 = luptr1 - nsupr;
  		        zz_mult(&comp_temp, &ukj2, &lusup[luptr2-1]);
		        z_sub(&ukj1, &ukj1, &comp_temp);

		        zz_mult(&comp_temp, &ukj1, &lusup[luptr1]);
        		zz_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
		        z_add(&comp_temp, &comp_temp, &comp_temp1);
		        z_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			dense_col[lsub[krep_ind-1]] = ukj1;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    luptr++; luptr1++; luptr2++;
			    zz_mult(&comp_temp, &ukj, &lusup[luptr]);
			    zz_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    z_add(&comp_temp, &comp_temp, &comp_temp1);
			    zz_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
			    z_add(&comp_temp, &comp_temp, &comp_temp1);
			    z_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    }

		} else  {	/* segsze >= 4 */
		    
		    /* Copy U[*,j] segment from dense[*] to TriTmp[*], which
		       holds the result of triangular solves.    */
		    no_zeros = kfnz - fsupc;
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; ++i) {
			irow = lsub[isub];
			TriTmp[i] = dense_col[irow]; /* Gather */
			++isub;
		    }
		    
		    /* start effective triangle */
		    luptr += nsupr * no_zeros + no_zeros;

#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
			   &nsupr, TriTmp, &incx );
#else
		    ztrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
			   &nsupr, TriTmp, &incx );
#endif
#else		
		    zlsolve ( nsupr, segsze, &lusup[luptr], TriTmp );
#endif
		    

		} /* else ... */
	    
	    }  /* for jj ... end tri-solves */

	    /* Block row updates; push all the way into dense[*] block */
	    for ( r_ind = 0; r_ind < nrow; r_ind += rowblk ) {
		
		r_hi = SUPERLU_MIN(nrow, r_ind + rowblk);
		block_nrow = SUPERLU_MIN(rowblk, r_hi - r_ind);
		luptr = xlusup[fsupc] + nsupc + r_ind;
		isub1 = lptr + nsupc + r_ind;
		
		repfnz_col = repfnz;
		TriTmp = tempv;
		dense_col = dense;
		
		/* Sequence through each column in panel -- matrix-vector */
		for (jj = jcol; jj < jcol + w; jj++,
		     repfnz_col += m, dense_col += m, TriTmp += ldaTmp) {
		    
		    kfnz = repfnz_col[krep];
		    if ( kfnz == SLU_EMPTY ) continue; /* Skip any zero segment */
		    
		    segsze = krep - kfnz + 1;
		    if ( segsze <= 3 ) continue;   /* skip unrolled cases */
		    
		    /* Perform a block update, and scatter the result of
		       matrix-vector to dense[].		 */
		    no_zeros = kfnz - fsupc;
		    luptr1 = luptr + nsupr * no_zeros;
		    MatvecTmp = &TriTmp[maxsuper];
		    
#ifdef USE_VENDOR_BLAS
		    alpha = one; 
                    beta = zero;
#ifdef _CRAY
		    CGEMV(ftcs2, &block_nrow, &segsze, &alpha, &lusup[luptr1], 
			   &nsupr, TriTmp, &incx, &beta, MatvecTmp, &incy);
#else
		    zgemv_("N", &block_nrow, &segsze, &alpha, &lusup[luptr1], 
			   &nsupr, TriTmp, &incx, &beta, MatvecTmp, &incy);
#endif
#else
		    zmatvec(nsupr, block_nrow, segsze, &lusup[luptr1],
			   TriTmp, MatvecTmp);
#endif
		    
		    /* Scatter MatvecTmp[*] into SPA dense[*] temporarily
		     * such that MatvecTmp[*] can be re-used for the
		     * the next blok row update. dense[] will be copied into 
		     * global store after the whole panel has been finished.
		     */
		    isub = isub1;
		    for (i = 0; i < block_nrow; i++) {
			irow = lsub[isub];
		        z_sub(&dense_col[irow], &dense_col[irow], 
                              &MatvecTmp[i]);
			MatvecTmp[i] = zero;
			++isub;
		    }
		    
		} /* for jj ... */
		
	    } /* for each block row ... */
	    
	    /* Scatter the triangular solves into SPA dense[*] */
	    repfnz_col = repfnz;
	    TriTmp = tempv;
	    dense_col = dense;
	    
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m, TriTmp += ldaTmp) {
		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue; /* Skip any zero segment */
		
		segsze = krep - kfnz + 1;
		if ( segsze <= 3 ) continue; /* skip unrolled cases */
		
		no_zeros = kfnz - fsupc;		
		isub = lptr + no_zeros;
		for (i = 0; i < segsze; i++) {
		    irow = lsub[isub];
		    dense_col[irow] = TriTmp[i];
		    TriTmp[i] = zero;
		    ++isub;
		}
		
	    } /* for jj ... */
	    
	} else { /* 1-D block modification */
	    
	    
	    /* Sequence through each column in the panel */
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m) {
		
		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue;	/* Skip any zero segment */
		
		segsze = krep - kfnz + 1;
		luptr = xlusup[fsupc];

		ops[TRSV] += 4 * segsze * (segsze - 1);
		ops[GEMV] += 8 * nrow * segsze;
		
		/* Case 1: Update U-segment of size 1 -- col-col update */
		if ( segsze == 1 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc;

		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; i++) {
			irow = lsub[i];
	    	        zz_mult(&comp_temp, &ukj, &lusup[luptr]);
		        z_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			++luptr;
		    }

		} else if ( segsze <= 3 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc-1;
		    ukj1 = dense_col[lsub[krep_ind - 1]];
		    luptr1 = luptr - nsupr;

		    if ( segsze == 2 ) {
		        zz_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		        z_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    ++luptr;  ++luptr1;
			    zz_mult(&comp_temp, &ukj, &lusup[luptr]);
			    zz_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    z_add(&comp_temp, &comp_temp, &comp_temp1);
			    z_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    } else {
			ukj2 = dense_col[lsub[krep_ind - 2]];
			luptr2 = luptr1 - nsupr;
  		        zz_mult(&comp_temp, &ukj2, &lusup[luptr2-1]);
		        z_sub(&ukj1, &ukj1, &comp_temp);

		        zz_mult(&comp_temp, &ukj1, &lusup[luptr1]);
        		zz_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
		        z_add(&comp_temp, &comp_temp, &comp_temp1);
		        z_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			dense_col[lsub[krep_ind-1]] = ukj1;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    ++luptr; ++luptr1; ++luptr2;
			    zz_mult(&comp_temp, &ukj, &lusup[luptr]);
			    zz_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    z_add(&comp_temp, &comp_temp, &comp_temp1);
			    zz_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
			    z_add(&comp_temp, &comp_temp, &comp_temp1);
			    z_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    }

		} else  { /* segsze >= 4 */
		    /* 
		     * Perform a triangular solve and block update,
		     * then scatter the result of sup-col update to dense[].
		     */
		    no_zeros = kfnz - fsupc;
		    
		    /* Copy U[*,j] segment from dense[*] to tempv[*]: 
		     *    The result of triangular solve is in tempv[*];
		     *    The result of matrix vector update is in dense_col[*]
		     */
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; ++i) {
			irow = lsub[isub];
			tempv[i] = dense_col[irow]; /* Gather */
			++isub;
		    }
		    
		    /* start effective triangle */
		    luptr += nsupr * no_zeros + no_zeros;
		    
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
			   &nsupr, tempv, &incx );
#else
		    ztrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
			   &nsupr, tempv, &incx );
#endif
		    
		    luptr += segsze;	/* Dense matrix-vector */
		    tempv1 = &tempv[segsze];
                    alpha = one;
                    beta = zero;
#ifdef _CRAY
		    CGEMV( ftcs2, &nrow, &segsze, &alpha, &lusup[luptr], 
			   &nsupr, tempv, &incx, &beta, tempv1, &incy );
#else
		    zgemv_( "N", &nrow, &segsze, &alpha, &lusup[luptr], 
			   &nsupr, tempv, &incx, &beta, tempv1, &incy );
#endif
#else
		    zlsolve ( nsupr, segsze, &lusup[luptr], tempv );
		    
		    luptr += segsze;        /* Dense matrix-vector */
		    tempv1 = &tempv[segsze];
		    zmatvec (nsupr, nrow, segsze, &lusup[luptr], tempv, tempv1);
#endif
		    
		    /* Scatter tempv[*] into SPA dense[*] temporarily, such
		     * that tempv[*] can be used for the triangular solve of
		     * the next column of the panel. They will be copied into 
		     * ucol[*] after the whole panel has been finished.
		     */
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; i++) {
			irow = lsub[isub];
			dense_col[irow] = tempv[i];
			tempv[i] = zero;
			isub++;
		    }
		    
		    /* Scatter the update from tempv1[*] into SPA dense[*] */
		    /* Start dense rectangular L */
		    for (i = 0; i < nrow; i++) {
			irow = lsub[isub];
		        z_sub(&dense_col[irow], &dense_col[irow], &tempv1[i]);
			tempv1[i] = zero;
			++isub;	
		    }
		    
		} /* else segsze>=4 ... */
		
	    } /* for each column in the panel... */
	    
	} /* else 1-D update ... */

    } /* for each updating supernode ... */

}